

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
insert<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
          (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                 table,size_t pos,RawSchema **params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  uint uVar3;
  Entry *this_00;
  uint *puVar4;
  uint uVar5;
  unsigned_long uVar6;
  long *in_R9;
  uint *puVar7;
  Maybe<unsigned_long> MVar8;
  
  this_00 = table.ptr;
  if ((ulong)((long)this_00[1].value.super_Schema.raw * 2) <
      ((long)&((this_00->value).super_Schema.raw)->generic + pos) * 3 + 3) {
    HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>::
    rehash((HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>
            *)this_00,pos * 3 + 3);
  }
  uVar3 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,(RawSchema *)*in_R9);
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          this_00[1].value.super_Schema.raw;
  uVar5 = (int)aVar2.value - 1U & uVar3;
  puVar4 = (uint *)0x0;
  do {
    puVar7 = (uint *)(this_00[1].key + (ulong)uVar5 * 8);
    uVar1 = puVar7[1];
    if (uVar1 == 1) {
      if (puVar4 == (uint *)0x0) {
        puVar4 = puVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (puVar4 != (uint *)0x0) {
          (this_00->value).super_Schema.raw =
               (RawBrandedSchema *)
               ((long)&(this_00->value).super_Schema.raw[-1].lazyInitializer + 7);
          puVar7 = puVar4;
        }
        *(ulong *)puVar7 = ((ulong)uVar3 | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                 )0x0;
        goto LAB_00397a67;
      }
      if ((*puVar7 == uVar3) && (*(long *)(table.size_ + (ulong)(uVar1 - 2) * 0x28) == *in_R9)) {
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_00397a67:
        MVar8.ptr.field_1.value = aVar2.value;
        MVar8.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar8.ptr;
      }
    }
    uVar6 = (ulong)uVar5 + 1;
    uVar5 = (uint)uVar6;
    if (uVar6 == aVar2.value) {
      uVar5 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }